

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

bool __thiscall
argstest::ArgumentParser::
ParseShort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  size_type *psVar4;
  char cVar5;
  _Alloc_hider _Var6;
  undefined1 *puVar7;
  bool bVar8;
  string value;
  string errorMessage;
  string local_a8;
  string *local_88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argchunk;
  FlagBase *flag;
  
  local_80 = it;
  std::__cxx11::string::substr((ulong)&argchunk,(ulong)it->_M_current);
  if (argchunk._M_string_length == 0) {
    bVar8 = true;
  }
  else {
    paVar1 = &value.field_2;
    local_88 = (string *)&(this->super_Command).super_Group.super_Base.errorMsg;
    _Var6 = argchunk._M_dataplus;
    do {
      puVar7 = (undefined1 *)((long)&value.field_2 + 8);
      value._M_dataplus._M_p._1_1_ = *_Var6._M_p;
      value._M_dataplus._M_p._0_1_ = 1;
      value.field_2._M_allocated_capacity = 0;
      value.field_2._8_8_ = value.field_2._8_8_ & 0xffffffffffffff00;
      value._M_string_length = (size_type)puVar7;
      iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&value);
      flag = (FlagBase *)CONCAT44(extraout_var,iVar2);
      if ((undefined1 *)value._M_string_length != puVar7) {
        operator_delete((void *)value._M_string_length);
      }
      if (flag == (FlagBase *)0x0) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_a8,'\x01');
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1d90e6);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar4) {
          errorMessage.field_2._M_allocated_capacity = *psVar4;
          errorMessage.field_2._8_8_ = plVar3[3];
          errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
        }
        else {
          errorMessage.field_2._M_allocated_capacity = *psVar4;
          errorMessage._M_dataplus._M_p = (pointer)*plVar3;
        }
        errorMessage._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&errorMessage);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar4) {
          value.field_2._M_allocated_capacity = *psVar4;
          value.field_2._8_8_ = plVar3[3];
          value._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          value.field_2._M_allocated_capacity = *psVar4;
          value._M_dataplus._M_p = (pointer)*plVar3;
        }
        value._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
          operator_delete(errorMessage._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        (this->super_Command).super_Group.super_Base.error = Parse;
        std::__cxx11::string::_M_assign(local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value._M_dataplus._M_p != paVar1) {
          operator_delete(value._M_dataplus._M_p);
        }
        cVar5 = '\x01';
      }
      else {
        value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&value,_Var6._M_p + 1,
                   argchunk._M_dataplus._M_p + argchunk._M_string_length);
        values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_a8,'\x01');
        ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (&errorMessage,this,flag,&local_a8,local_80,end,this->allowSeparateShortValue,
                   this->allowJoinedShortValue,value._M_string_length != 0,&value,
                   value._M_string_length != 0,&values);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if (errorMessage._M_string_length == 0) {
          if (this->readCompletion == false) {
            (*(flag->super_NamedBase).super_Base._vptr_Base[0x16])(flag,&values);
          }
          if (((flag->super_NamedBase).super_Base.options & KickOut) == None) {
            cVar5 = (values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start !=
                    values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) * '\x02';
          }
          else {
            local_80->_M_current = local_80->_M_current + 1;
            cVar5 = '\x01';
          }
        }
        else {
          (this->super_Command).super_Group.super_Base.error = Parse;
          cVar5 = '\x01';
          std::__cxx11::string::_M_assign(local_88);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)errorMessage._M_dataplus._M_p != &errorMessage.field_2) {
          operator_delete(errorMessage._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&values);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value._M_dataplus._M_p != paVar1) {
          operator_delete(value._M_dataplus._M_p);
        }
      }
      if (cVar5 != '\0') goto LAB_001b9979;
      _Var6._M_p = _Var6._M_p + 1;
    } while (_Var6._M_p != argchunk._M_dataplus._M_p + argchunk._M_string_length);
    cVar5 = '\x02';
LAB_001b9979:
    bVar8 = cVar5 == '\x02';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argchunk._M_dataplus._M_p != &argchunk.field_2) {
    operator_delete(argchunk._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool ParseShort(It &it, It end)
            {
                const auto &chunk = *it;
                const auto argchunk = chunk.substr(shortprefix.size());
                for (auto argit = std::begin(argchunk); argit != std::end(argchunk); ++argit)
                {
                    const auto arg = *argit;

                    if (auto flag = Match(arg))
                    {
                        const std::string value(argit + 1, std::end(argchunk));
                        std::vector<std::string> values;
                        const std::string errorMessage = ParseArgsValues(*flag, std::string(1, arg), it, end,
                                                                         allowSeparateShortValue, allowJoinedShortValue,
                                                                         !value.empty(), value, !value.empty(), values);

                        if (!errorMessage.empty())
                        {
#ifndef ARGS_NOEXCEPT
                            throw ParseError(errorMessage);
#else
                            error = Error::Parse;
                            errorMsg = errorMessage;
                            return false;
#endif
                        }

                        if (!readCompletion)
                        {
                            flag->ParseValue(values);
                        }

                        if (flag->KickOut())
                        {
                            ++it;
                            return false;
                        }

                        if (!values.empty())
                        {
                            break;
                        }
                    } else
                    {
                        const std::string errorMessage("Flag could not be matched: '" + std::string(1, arg) + "'");
#ifndef ARGS_NOEXCEPT
                        throw ParseError(errorMessage);
#else
                        error = Error::Parse;
                        errorMsg = errorMessage;
                        return false;
#endif
                    }
                }

                return true;
            }